

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O1

void glfwSetWindowPos(GLFWwindow *handle,int xpos,int ypos)

{
  int iVar1;
  XSizeHints *pXVar2;
  _GLFWwindow *window;
  XWindowAttributes XStack_b0;
  
  if (handle == (GLFWwindow *)0x0) {
    __assert_fail("window != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/glfw/src/window.c"
                  ,0x21d,"void glfwSetWindowPos(GLFWwindow *, int, int)");
  }
  if (_glfw.initialized != 0) {
    if (*(long *)(handle + 0x48) != 0) {
      return;
    }
    (*_glfw.x11.xlib.GetWindowAttributes)(_glfw.x11.display,*(Window *)(handle + 0x350),&XStack_b0);
    if (XStack_b0.map_state != 2) {
      pXVar2 = (*_glfw.x11.xlib.AllocSizeHints)();
      iVar1 = (*_glfw.x11.xlib.GetWMNormalHints)
                        (_glfw.x11.display,*(Window *)(handle + 0x350),pXVar2,(long *)&XStack_b0);
      if (iVar1 != 0) {
        *(byte *)&pXVar2->flags = (byte)pXVar2->flags | 4;
        pXVar2->x = 0;
        pXVar2->y = 0;
        (*_glfw.x11.xlib.SetWMNormalHints)(_glfw.x11.display,*(Window *)(handle + 0x350),pXVar2);
      }
      (*_glfw.x11.xlib.Free)(pXVar2);
    }
    (*_glfw.x11.xlib.MoveWindow)(_glfw.x11.display,*(Window *)(handle + 0x350),xpos,ypos);
    (*_glfw.x11.xlib.Flush)(_glfw.x11.display);
    return;
  }
  _glfwInputError(0x10001,(char *)0x0);
  return;
}

Assistant:

GLFWAPI void glfwSetWindowPos(GLFWwindow* handle, int xpos, int ypos)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);

    _GLFW_REQUIRE_INIT();

    if (window->monitor)
        return;

    _glfwPlatformSetWindowPos(window, xpos, ypos);
}